

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# KinDynComputations.cpp
# Opt level: O0

bool __thiscall
iDynTree::KinDynComputations::getCentroidalAverageVelocity
          (KinDynComputations *this,Span<double,__1L> vel)

{
  index_type iVar1;
  Map<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0,_Eigen::Stride<0,_0>_> *in_RSI;
  DenseBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_> *in_RDI;
  bool bVar2;
  bool ok;
  int expected_spatial_velocity_size;
  KinDynComputations *in_stack_00000228;
  storage_type<iDynTree::details::extent_type<_1L>_> in_stack_ffffffffffffff70;
  undefined4 in_stack_ffffffffffffffd8;
  undefined4 uVar3;
  undefined4 uVar4;
  
  uVar4 = 6;
  iVar1 = Span<double,_-1L>::size((Span<double,__1L> *)0x1cecf3);
  bVar2 = iVar1 == 6;
  uVar3 = CONCAT13(bVar2,(int3)in_stack_ffffffffffffffd8);
  if (bVar2) {
    getCentroidalAverageVelocity(in_stack_00000228);
    toEigen((SpatialMotionVector *)CONCAT44(uVar4,uVar3));
    toEigen((Span<double,__1L>)in_stack_ffffffffffffff70);
    Eigen::Map<Eigen::Matrix<double,-1,1,0,-1,1>,0,Eigen::Stride<0,0>>::operator=(in_RSI,in_RDI);
  }
  else {
    iDynTree::reportError
              ("KinDynComputations","getCentroidalAverageVelocity","Wrong size in input vel");
  }
  return bVar2;
}

Assistant:

bool KinDynComputations::getCentroidalAverageVelocity(Span<double> vel)
{
    constexpr int expected_spatial_velocity_size = 6;
    bool ok = vel.size() == expected_spatial_velocity_size;
    if( !ok )
    {
        reportError("KinDynComputations","getCentroidalAverageVelocity","Wrong size in input vel");
        return false;
    }

    toEigen(vel) = toEigen(getCentroidalAverageVelocity());

    return true;
}